

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_7a9696::HandleRPathRemoveCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  bool bVar1;
  reference str;
  cmMakefile *pcVar2;
  ulong uVar3;
  static_string_view name;
  char local_3a1;
  cmAlphaNum local_3a0;
  cmAlphaNum local_370;
  undefined1 local_340 [8];
  string message;
  cmAlphaNum local_2f0;
  string local_2c0;
  bool local_299;
  undefined1 local_298 [7];
  bool removed;
  string emsg;
  cmFileTimes ft;
  undefined1 local_268 [7];
  bool success;
  cmAlphaNum local_238;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  undefined4 local_1bc;
  cmAlphaNum local_1b8;
  cmAlphaNum local_188;
  string local_158;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_138;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_128;
  undefined1 local_118 [8];
  ParseResult parseResult;
  undefined1 local_c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  cmArgumentParser<void> parser;
  string file;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  std::__cxx11::string::string
            ((string *)
             ((long)&parser.super_Base.Bindings.Positions.
                     super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                     .
                     super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                     ._M_impl + 0x10));
  cmArgumentParser<void>::cmArgumentParser
            ((cmArgumentParser<void> *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_c8);
  name = ::cm::operator____s("FILE",4);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            ((cmArgumentParser<void> *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,name,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&parser.super_Base.Bindings.Positions.
                     super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                     .
                     super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                     ._M_impl + 0x10));
  local_138 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        (args);
  local_128 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::advance(&local_138,1);
  cmArgumentParser<void>::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((ParseResult *)local_118,
             (cmArgumentParser<void> *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_128,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_c8,0);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c8);
  if (bVar1) {
    pcVar2 = cmExecutionStatus::GetMakefile(status);
    bVar1 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_118,pcVar2);
    if (bVar1) {
      args_local._7_1_ = true;
      local_1bc = 1;
    }
    else {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        bVar1 = cmsys::SystemTools::FileExists
                          ((string *)
                           ((long)&parser.super_Base.Bindings.Positions.
                                   super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                   .
                                   super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                   ._M_impl + 0x10),true);
        if (bVar1) {
          cmFileTimes::cmFileTimes
                    ((cmFileTimes *)((long)&emsg.field_2 + 8),
                     (string *)
                     ((long)&parser.super_Base.Bindings.Positions.
                             super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                             .
                             super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                             ._M_impl + 0x10));
          std::__cxx11::string::string((string *)local_298);
          bVar1 = cmSystemTools::RemoveRPath
                            ((string *)
                             ((long)&parser.super_Base.Bindings.Positions.
                                     super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                     .
                                     super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                     ._M_impl + 0x10),(string *)local_298,&local_299);
          if (!bVar1) {
            cmAlphaNum::cmAlphaNum(&local_2f0,"RPATH_REMOVE could not remove RPATH from file: \n  ")
            ;
            cmAlphaNum::cmAlphaNum
                      ((cmAlphaNum *)((long)&message.field_2 + 8),
                       (string *)
                       ((long)&parser.super_Base.Bindings.Positions.
                               super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                               .
                               super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                               ._M_impl + 0x10));
            cmStrCat<char[2],std::__cxx11::string>
                      (&local_2c0,&local_2f0,(cmAlphaNum *)((long)&message.field_2 + 8),
                       (char (*) [2])0xc863b5,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_298);
            cmExecutionStatus::SetError(status,&local_2c0);
            std::__cxx11::string::~string((string *)&local_2c0);
          }
          ft.times._M_t.
          super___uniq_ptr_impl<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>._M_t.
          super__Tuple_impl<0UL,_cmFileTimes::Times_*,_std::default_delete<cmFileTimes::Times>_>.
          super__Head_base<0UL,_cmFileTimes::Times_*,_false>._M_head_impl._7_1_ = bVar1;
          if (ft.times._M_t.
              super___uniq_ptr_impl<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>.
              _M_t.
              super__Tuple_impl<0UL,_cmFileTimes::Times_*,_std::default_delete<cmFileTimes::Times>_>
              .super__Head_base<0UL,_cmFileTimes::Times_*,_false>._M_head_impl._7_1_) {
            if ((local_299 & 1U) != 0) {
              cmAlphaNum::cmAlphaNum(&local_370,"Removed runtime path from \"");
              cmAlphaNum::cmAlphaNum
                        (&local_3a0,
                         (string *)
                         ((long)&parser.super_Base.Bindings.Positions.
                                 super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                 .
                                 super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                 ._M_impl + 0x10));
              local_3a1 = '\"';
              cmStrCat<char>((string *)local_340,&local_370,&local_3a0,&local_3a1);
              pcVar2 = cmExecutionStatus::GetMakefile(status);
              cmMakefile::DisplayStatus(pcVar2,(string *)local_340,-1.0);
              std::__cxx11::string::~string((string *)local_340);
            }
            cmFileTimes::Store((cmFileTimes *)((long)&emsg.field_2 + 8),
                               (string *)
                               ((long)&parser.super_Base.Bindings.Positions.
                                       super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                       .
                                       super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                                       ._M_impl + 0x10));
          }
          args_local._7_1_ =
               ft.times._M_t.
               super___uniq_ptr_impl<cmFileTimes::Times,_std::default_delete<cmFileTimes::Times>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmFileTimes::Times_*,_std::default_delete<cmFileTimes::Times>_>
               .super__Head_base<0UL,_cmFileTimes::Times_*,_false>._M_head_impl._7_1_;
          local_1bc = 1;
          std::__cxx11::string::~string((string *)local_298);
          cmFileTimes::~cmFileTimes((cmFileTimes *)((long)&emsg.field_2 + 8));
        }
        else {
          cmAlphaNum::cmAlphaNum(&local_238,"RPATH_REMOVE given FILE \"");
          cmAlphaNum::cmAlphaNum
                    ((cmAlphaNum *)local_268,
                     (string *)
                     ((long)&parser.super_Base.Bindings.Positions.
                             super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                             .
                             super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                             ._M_impl + 0x10));
          cmStrCat<char[23]>(&local_208,&local_238,(cmAlphaNum *)local_268,
                             (char (*) [23])"\" that does not exist.");
          cmExecutionStatus::SetError(status,&local_208);
          std::__cxx11::string::~string((string *)&local_208);
          args_local._7_1_ = false;
          local_1bc = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e0,"RPATH_REMOVE not given FILE option.",&local_1e1);
        cmExecutionStatus::SetError(status,&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::allocator<char>::~allocator(&local_1e1);
        args_local._7_1_ = false;
        local_1bc = 1;
      }
    }
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_188,"RPATH_REMOVE given unknown argument ");
    str = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c8);
    cmAlphaNum::cmAlphaNum(&local_1b8,str);
    cmStrCat<>(&local_158,&local_188,&local_1b8);
    cmExecutionStatus::SetError(status,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    args_local._7_1_ = false;
    local_1bc = 1;
  }
  ArgumentParser::ParseResult::~ParseResult((ParseResult *)local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c8);
  cmArgumentParser<void>::~cmArgumentParser
            ((cmArgumentParser<void> *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             ((long)&parser.super_Base.Bindings.Positions.
                     super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                     .
                     super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                     ._M_impl + 0x10));
  return args_local._7_1_;
}

Assistant:

bool HandleRPathRemoveCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  // Evaluate arguments.
  std::string file;
  cmArgumentParser<void> parser;
  std::vector<std::string> unknownArgs;
  parser.Bind("FILE"_s, file);
  ArgumentParser::ParseResult parseResult =
    parser.Parse(cmMakeRange(args).advance(1), &unknownArgs);
  if (!unknownArgs.empty()) {
    status.SetError(
      cmStrCat("RPATH_REMOVE given unknown argument ", unknownArgs.front()));
    return false;
  }
  if (parseResult.MaybeReportError(status.GetMakefile())) {
    return true;
  }
  if (file.empty()) {
    status.SetError("RPATH_REMOVE not given FILE option.");
    return false;
  }
  if (!cmSystemTools::FileExists(file, true)) {
    status.SetError(
      cmStrCat("RPATH_REMOVE given FILE \"", file, "\" that does not exist."));
    return false;
  }
  bool success = true;
  cmFileTimes const ft(file);
  std::string emsg;
  bool removed;
  if (!cmSystemTools::RemoveRPath(file, &emsg, &removed)) {
    status.SetError(
      cmStrCat("RPATH_REMOVE could not remove RPATH from file: \n  ", file,
               "\n", emsg));
    success = false;
  }
  if (success) {
    if (removed) {
      std::string message =
        cmStrCat("Removed runtime path from \"", file, '"');
      status.GetMakefile().DisplayStatus(message, -1);
    }
    ft.Store(file);
  }
  return success;
}